

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall sznet::net::EventLoop::loop(EventLoop *this)

{
  Poller *pPVar1;
  pointer ppCVar2;
  Channel *this_00;
  self *psVar3;
  LogStream *pLVar4;
  Timestamp now;
  undefined8 uVar5;
  pointer ppCVar6;
  ChannelList *__range3;
  SourceFile file;
  SourceFile file_00;
  Logger local_1020;
  undefined1 local_50 [12];
  undefined1 local_40 [12];
  
  if (this->m_looping != true) {
    assertInLoopThread(this);
    this->m_looping = true;
    LOCK();
    (this->m_quit)._M_base._M_i = false;
    UNLOCK();
    if (g_logLevel < 1) {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_50,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                );
      file._12_4_ = 0;
      file.m_data = (char *)local_50._0_8_;
      file.m_size = local_50._8_4_;
      Logger::Logger(&local_1020,file,0x5d,TRACE,"loop");
      psVar3 = LogStream::operator<<(&local_1020.m_impl.m_stream,"EventLoop ");
      pLVar4 = LogStream::operator<<(psVar3,this);
      LogStream::operator<<(pLVar4," start looping");
      Logger::~Logger(&local_1020);
    }
    while (((this->m_quit)._M_base._M_i & 1U) == 0) {
      ppCVar6 = (this->m_activeChannels).
                super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->m_activeChannels).
          super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppCVar6) {
        (this->m_activeChannels).
        super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppCVar6;
      }
      now = Timestamp::now();
      (this->m_pollTime).m_microSecondsSinceEpoch = now.m_microSecondsSinceEpoch;
      TimerQueue::expiredProcess
                ((this->m_timerQueue)._M_t.
                 super___uniq_ptr_impl<sznet::TimerQueue,_std::default_delete<sznet::TimerQueue>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_sznet::TimerQueue_*,_std::default_delete<sznet::TimerQueue>_>
                 .super__Head_base<0UL,_sznet::TimerQueue_*,_false>._M_head_impl,now);
      pPVar1 = (this->m_poller)._M_t.
               super___uniq_ptr_impl<sznet::net::Poller,_std::default_delete<sznet::net::Poller>_>.
               _M_t.
               super__Tuple_impl<0UL,_sznet::net::Poller_*,_std::default_delete<sznet::net::Poller>_>
               .super__Head_base<0UL,_sznet::net::Poller_*,_false>._M_head_impl;
      uVar5 = 0;
      if ((((this->m_timerQueue)._M_t.
            super___uniq_ptr_impl<sznet::TimerQueue,_std::default_delete<sznet::TimerQueue>_>._M_t.
            super__Tuple_impl<0UL,_sznet::TimerQueue_*,_std::default_delete<sznet::TimerQueue>_>.
            super__Head_base<0UL,_sznet::TimerQueue_*,_false>._M_head_impl)->m_activeTimers)._M_t.
          _M_impl.super__Rb_tree_header._M_node_count == 0) {
        uVar5 = 10000;
      }
      (*pPVar1->_vptr_Poller[2])(pPVar1,&this->m_activeChannels,uVar5);
      this->m_iteration = this->m_iteration + 1;
      if (g_logLevel < 1) {
        printActiveChannels(this);
      }
      this->m_eventHandling = true;
      ppCVar2 = (this->m_activeChannels).
                super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar6 = (this->m_activeChannels).
                     super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppCVar6 != ppCVar2;
          ppCVar6 = ppCVar6 + 1) {
        this_00 = *ppCVar6;
        this->m_currentActiveChannel = this_00;
        Channel::handleEvent(this_00,(Timestamp)(this->m_pollTime).m_microSecondsSinceEpoch);
      }
      this->m_currentActiveChannel = (Channel *)0x0;
      this->m_eventHandling = false;
      doPendingFunctors(this);
    }
    if (g_logLevel < 1) {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_40,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_40._0_8_;
      file_00.m_size = local_40._8_4_;
      Logger::Logger(&local_1020,file_00,0x7b,TRACE,"loop");
      psVar3 = LogStream::operator<<(&local_1020.m_impl.m_stream,"EventLoop ");
      pLVar4 = LogStream::operator<<(psVar3,this);
      LogStream::operator<<(pLVar4," stop looping");
      Logger::~Logger(&local_1020);
    }
    this->m_looping = false;
    return;
  }
  __assert_fail("!m_looping",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                ,0x59,"void sznet::net::EventLoop::loop()");
}

Assistant:

void EventLoop::loop()
{
	assert(!m_looping);
	assertInLoopThread();
	m_looping = true;
	m_quit = false;
	LOG_TRACE << "EventLoop " << this << " start looping";

	while (!m_quit)
	{
		m_activeChannels.clear();
		m_pollTime = Timestamp::now();
		// 优先处理到期timer
		m_timerQueue->expiredProcess(m_pollTime);
		// IO
		m_poller->poll(&m_activeChannels, m_timerQueue->earliestExpiredTime(m_pollTime, kPollTimeMs));
		++m_iteration;
		if (Logger::logLevel() <= Logger::TRACE)
		{
			printActiveChannels();
		}
		m_eventHandling = true;
		// 处理就绪事件
		for (Channel* channel : m_activeChannels)
		{
			m_currentActiveChannel = channel;
			m_currentActiveChannel->handleEvent(m_pollTime);
		}
		m_currentActiveChannel = nullptr;
		m_eventHandling = false;
		// 执行m_pendingFunctors中的任务回调
		// 这种设计使得IO线程也能执行一些计算任务，避免了IO线程在不忙时长期阻塞在IO multiplexing调用中
		// 这些任务显然必须是要求在IO线程中执行
		doPendingFunctors();
	}
	
	LOG_TRACE << "EventLoop " << this << " stop looping";
	m_looping = false;
}